

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArrayBuffer.cpp
# Opt level: O0

void __thiscall
Js::WebAssemblySharedArrayBuffer::WebAssemblySharedArrayBuffer
          (WebAssemblySharedArrayBuffer *this,DynamicType *type)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DynamicType *type_local;
  WebAssemblySharedArrayBuffer *this_local;
  
  JavascriptSharedArrayBuffer::JavascriptSharedArrayBuffer
            (&this->super_JavascriptSharedArrayBuffer,type);
  (this->super_JavascriptSharedArrayBuffer).super_SharedArrayBuffer.super_ArrayBufferBase.
  super_DynamicObject.super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject =
       (IRecyclerVisitedObject)&PTR_Finalize_01e42440;
  bVar2 = Wasm::Threads::IsEnabled();
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SharedArrayBuffer.cpp"
                                ,0x1df,"(Wasm::Threads::IsEnabled())","Wasm::Threads::IsEnabled()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

WebAssemblySharedArrayBuffer::WebAssemblySharedArrayBuffer(DynamicType * type):
        JavascriptSharedArrayBuffer(type)
    {
        AssertOrFailFast(Wasm::Threads::IsEnabled());
    }